

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::RunChild(cmCTestLaunch *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmsysProcess *cp;
  bool bVar1;
  int iVar2;
  cmProcessOutput processOutput;
  int length;
  string strdata;
  char *data;
  string local_470;
  string local_450;
  ofstream ferr;
  ofstream fout;
  
  __lhs = (this->RealArgs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if ((__lhs != (this->RealArgs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
     (bVar1 = std::operator==(__lhs,":"), !bVar1)) {
    cp = this->Process;
    cmsysProcess_SetCommand(cp,this->RealArgV);
    std::ofstream::ofstream(&fout);
    std::ofstream::ofstream(&ferr);
    if (this->Passthru == true) {
      cmsysProcess_SetPipeShared(cp,2,1);
      cmsysProcess_SetPipeShared(cp,3,1);
    }
    else {
      std::ofstream::open((char *)&fout,(_Ios_Openmode)(this->LogOut)._M_dataplus._M_p);
      std::ofstream::open((char *)&ferr,(_Ios_Openmode)(this->LogErr)._M_dataplus._M_p);
    }
    cmsysProcess_Execute(cp);
    if (this->Passthru == false) {
      data = (char *)0x0;
      length = 0;
      cmProcessOutput::cmProcessOutput(&processOutput,Auto,0x400);
      strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
      strdata._M_string_length = 0;
      strdata.field_2._M_local_buf[0] = '\0';
      do {
        while( true ) {
          while (iVar2 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar2 == 2) {
            cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,1);
            std::ostream::write((char *)&fout,(long)strdata._M_dataplus._M_p);
            std::ostream::write((char *)&std::cout,(long)strdata._M_dataplus._M_p);
            this->HaveOut = true;
          }
          if (iVar2 != 3) break;
          cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,2);
          std::ostream::write((char *)&ferr,(long)strdata._M_dataplus._M_p);
          std::ostream::write((char *)&std::cerr,(long)strdata._M_dataplus._M_p);
          this->HaveErr = true;
        }
      } while (iVar2 != 0);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      local_450._M_string_length = 0;
      local_450.field_2._M_local_buf[0] = '\0';
      cmProcessOutput::DecodeText(&processOutput,&local_450,&strdata,1);
      std::__cxx11::string::~string((string *)&local_450);
      if (strdata._M_string_length != 0) {
        std::ostream::write((char *)&fout,(long)strdata._M_dataplus._M_p);
        std::ostream::write((char *)&std::cout,(long)strdata._M_dataplus._M_p);
      }
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      local_470._M_string_length = 0;
      local_470.field_2._M_local_buf[0] = '\0';
      cmProcessOutput::DecodeText(&processOutput,&local_470,&strdata,2);
      std::__cxx11::string::~string((string *)&local_470);
      if (strdata._M_string_length != 0) {
        std::ostream::write((char *)&ferr,(long)strdata._M_dataplus._M_p);
        std::ostream::write((char *)&std::cerr,(long)strdata._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&strdata);
      cmProcessOutput::~cmProcessOutput(&processOutput);
    }
    cmsysProcess_WaitForExit(cp,(double *)0x0);
    iVar2 = cmsysProcess_GetExitValue(cp);
    this->ExitCode = iVar2;
    std::ofstream::~ofstream(&ferr);
    std::ofstream::~ofstream(&fout);
    return;
  }
  this->ExitCode = 0;
  return;
}

Assistant:

void cmCTestLaunch::RunChild()
{
  // Ignore noopt make rules
  if (this->RealArgs.empty() || this->RealArgs[0] == ":") {
    this->ExitCode = 0;
    return;
  }

  // Prepare to run the real command.
  cmsysProcess* cp = this->Process;
  cmsysProcess_SetCommand(cp, this->RealArgV);

  cmsys::ofstream fout;
  cmsys::ofstream ferr;
  if (this->Passthru) {
    // In passthru mode we just share the output pipes.
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
  } else {
    // In full mode we record the child output pipes to log files.
    fout.open(this->LogOut.c_str(), std::ios::out | std::ios::binary);
    ferr.open(this->LogErr.c_str(), std::ios::out | std::ios::binary);
  }

#ifdef _WIN32
  // Do this so that newline transformation is not done when writing to cout
  // and cerr below.
  _setmode(fileno(stdout), _O_BINARY);
  _setmode(fileno(stderr), _O_BINARY);
#endif

  // Run the real command.
  cmsysProcess_Execute(cp);

  // Record child stdout and stderr if necessary.
  if (!this->Passthru) {
    char* data = nullptr;
    int length = 0;
    cmProcessOutput processOutput;
    std::string strdata;
    while (int p = cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
      if (p == cmsysProcess_Pipe_STDOUT) {
        processOutput.DecodeText(data, length, strdata, 1);
        fout.write(strdata.c_str(), strdata.size());
        std::cout.write(strdata.c_str(), strdata.size());
        this->HaveOut = true;
      } else if (p == cmsysProcess_Pipe_STDERR) {
        processOutput.DecodeText(data, length, strdata, 2);
        ferr.write(strdata.c_str(), strdata.size());
        std::cerr.write(strdata.c_str(), strdata.size());
        this->HaveErr = true;
      }
    }
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      fout.write(strdata.c_str(), strdata.size());
      std::cout.write(strdata.c_str(), strdata.size());
    }
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      ferr.write(strdata.c_str(), strdata.size());
      std::cerr.write(strdata.c_str(), strdata.size());
    }
  }

  // Wait for the real command to finish.
  cmsysProcess_WaitForExit(cp, nullptr);
  this->ExitCode = cmsysProcess_GetExitValue(cp);
}